

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O0

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::set_graph_from_OFF
          (Cover_complex<std::vector<float,_std::allocator<float>_>_> *this)

{
  edges_size_type eVar1;
  ostream *this_00;
  Cover_complex<std::vector<float,_std::allocator<float>_>_> *this_local;
  
  remove_edges(this,&this->one_skeleton);
  eVar1 = boost::
          num_edges<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_index_t,int,boost::property<boost::edge_weight_t,double,boost::no_property>>,boost::no_property,boost::listS>>
                    (&this->one_skeleton_OFF);
  if (eVar1 == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"No triangulation read in OFF file!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    boost::
    subgraph<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>_>
    ::operator=(&this->one_skeleton,&this->one_skeleton_OFF);
  }
  return;
}

Assistant:

void set_graph_from_OFF() {
    remove_edges(one_skeleton);
    if (num_edges(one_skeleton_OFF))
      one_skeleton = one_skeleton_OFF;
    else
      std::cerr << "No triangulation read in OFF file!" << std::endl;
  }